

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

int __thiscall WavingSketch<8U,_16U,_4U>::Query(WavingSketch<8U,_16U,_4U> *this,Data<4U> *item)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (*(int *)item->str * 0x16a88000 | (uint)(*(int *)item->str * -0x3361d2af) >> 0x11) *
          0x1b873593 ^ this->seed_choice;
  uVar1 = (uVar1 >> 0x13 | uVar1 << 0xd) * 5 + 0xe6546b64;
  uVar1 = (uVar1 >> 0x10 ^ uVar1 ^ 4) * -0x7a143595;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51cb;
  iVar2 = Bucket::Query(this->buckets + (ulong)(uVar1 >> 0x10 ^ uVar1) % (ulong)this->BUCKET_NUM,
                        item,this->seed_s,this->seed_incast,false);
  return iVar2;
}

Assistant:

uint32_t inline MurmurHash3_x86_32(const void* key, int len, uint32_t seed) {
	const uint8_t* data = (const uint8_t*)key;
	const int nblocks = len / 4;
	int i;

	uint32_t h1 = seed;

	uint32_t c1 = 0xcc9e2d51;
	uint32_t c2 = 0x1b873593;

	//----------
	// body

	const uint32_t* blocks = (const uint32_t*)(data + nblocks * 4);

	for (i = -nblocks; i; i++) {
		uint32_t k1 = getblock(blocks, i);

		k1 *= c1;
		k1 = ROTL32(k1, 15);
		k1 *= c2;

		h1 ^= k1;
		h1 = ROTL32(h1, 13);
		h1 = h1 * 5 + 0xe6546b64;
	}

	//----------
	// tail

	const uint8_t* tail = (const uint8_t*)(data + nblocks * 4);

	uint32_t k1 = 0;

	switch (len & 3) {
	case 3:
		k1 ^= tail[2] << 16;
	case 2:
		k1 ^= tail[1] << 8;
	case 1:
		k1 ^= tail[0];
		k1 *= c1;
		k1 = ROTL32(k1, 15);
		k1 *= c2;
		h1 ^= k1;
	};

	//----------
	// finalization

	h1 ^= len;

	h1 = fmix32(h1);

	return h1;
}